

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool loadfirstvalue_largeorequal(roaring_uint32_iterator_t *newit,uint32_t val)

{
  _Bool _Var1;
  roaring_container_iterator_t rVar2;
  long in_RDI;
  uint16_t *unaff_retaddr;
  _Bool found;
  roaring_container_iterator_t *in_stack_00000008;
  uint16_t value;
  _Bool partial_init;
  roaring_uint32_iterator_t *in_stack_ffffffffffffffd8;
  long lVar3;
  uint16_t in_stack_fffffffffffffffe;
  
  _Var1 = iter_new_container_partial_init(in_stack_ffffffffffffffd8);
  if (_Var1) {
    lVar3 = in_RDI;
    rVar2 = container_init_iterator(newit,val._3_1_,(uint16_t *)in_stack_00000008);
    *(int32_t *)(lVar3 + 0x1c) = rVar2.index;
    _Var1 = container_iterator_lower_bound
                      (newit,val._3_1_,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffe);
    if (_Var1) {
      *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RDI + 0x18);
      _Var1 = true;
    }
    else {
      _Var1 = false;
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

CROARING_WARN_UNUSED static bool loadfirstvalue_largeorequal(
    roaring_uint32_iterator_t *newit, uint32_t val) {
    bool partial_init = iter_new_container_partial_init(newit);
    assert(partial_init);
    if (!partial_init) {
        return false;
    }
    uint16_t value = 0;
    newit->container_it =
        container_init_iterator(newit->container, newit->typecode, &value);
    bool found = container_iterator_lower_bound(
        newit->container, newit->typecode, &newit->container_it, &value,
        val & 0xFFFF);
    assert(found);
    if (!found) {
        return false;
    }
    newit->current_value = newit->highbits | value;
    return true;
}